

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_search.c
# Opt level: O3

REF_STATUS
ref_search_trim(REF_SEARCH ref_search,REF_INT parent,REF_DBL *position,REF_DBL *trim_radius)

{
  int iVar1;
  REF_STATUS RVar2;
  REF_DBL *in_RAX;
  long lVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  RVar2 = (REF_STATUS)in_RAX;
  if (parent != -1) {
    do {
      if (ref_search->n <= parent) break;
      in_RAX = (REF_DBL *)ref_search->item;
      lVar4 = (long)parent;
      if (*(int *)((long)in_RAX + lVar4 * 4) == -1) break;
      iVar1 = ref_search->d;
      if ((long)iVar1 < 1) {
        dVar5 = 0.0;
      }
      else {
        dVar5 = 0.0;
        lVar3 = 0;
        do {
          dVar6 = position[lVar3] - ref_search->pos[parent * iVar1 + lVar3];
          dVar5 = dVar5 + dVar6 * dVar6;
          lVar3 = lVar3 + 1;
        } while (iVar1 != lVar3);
      }
      if (dVar5 < 0.0) {
        dVar5 = sqrt(dVar5);
      }
      else {
        dVar5 = SQRT(dVar5);
      }
      dVar7 = ref_search->radius[lVar4] + dVar5;
      dVar6 = *trim_radius;
      if (dVar7 < *trim_radius) {
        *trim_radius = dVar7;
        dVar6 = dVar7;
      }
      in_RAX = ref_search->children_ball;
      if (dVar6 <= dVar5 - in_RAX[lVar4]) break;
      ref_search_trim(ref_search,ref_search->left[lVar4],position,trim_radius);
      in_RAX = (REF_DBL *)ref_search->right;
      parent = *(int *)((long)in_RAX + lVar4 * 4);
    } while (parent != -1);
    RVar2 = (REF_STATUS)in_RAX;
  }
  return RVar2;
}

Assistant:

REF_FCN static REF_STATUS ref_search_trim(REF_SEARCH ref_search, REF_INT parent,
                                          REF_DBL *position,
                                          REF_DBL *trim_radius) {
  REF_INT i;
  REF_DBL distance;

  if (REF_EMPTY == parent) return REF_SUCCESS;
  if (parent >= ref_search->n) return REF_SUCCESS;
  if (REF_EMPTY == ref_search->item[parent]) return REF_SUCCESS;

  distance = 0.0;
  for (i = 0; i < ref_search->d; i++)
    distance +=
        pow(position[i] - ref_search->pos[i + ref_search->d * parent], 2);
  distance = sqrt(distance);

  if (distance + ref_search->radius[parent] < *trim_radius) {
    *trim_radius = distance + ref_search->radius[parent];
  }

  /* if the trim_distance is larger than the distance between me and the target
   * minus the children_ball look for better */
  if (*trim_radius > distance - ref_search->children_ball[parent]) {
    RSS(ref_search_trim(ref_search, ref_search->left[parent], position,
                        trim_radius),
        "gthr");
    RSS(ref_search_trim(ref_search, ref_search->right[parent], position,
                        trim_radius),
        "gthr");
  }

  return REF_SUCCESS;
}